

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cond_eq.h
# Opt level: O3

void __thiscall
mp::
CondEQConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::LinTerms>
::ConvertCtxNeg(CondEQConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::LinTerms>
                *this,ItemType *eq0c,int param_2)

{
  LinTerms *lt;
  double *pdVar1;
  int iVar2;
  BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *this_00;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *pFVar3;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  *pFVar4;
  ulong uVar5;
  double dVar6;
  NodeRange NVar7;
  initializer_list<double> __l;
  int res;
  vector<int,_std::allocator<int>_> newvars;
  PreprocessInfoStd bNt;
  int local_7b8;
  allocator_type local_7b1;
  double local_7b0;
  vector<int,_std::allocator<int>_> local_7a8;
  SmallVec<int,_6> *local_790;
  vector<double,_std::allocator<double>_> local_788;
  PreprocessInfoStd local_770;
  undefined1 local_758 [72];
  ptr local_710;
  ulong local_708;
  undefined1 local_6e0 [72];
  ptr local_698;
  ulong local_690;
  undefined1 local_668 [72];
  ptr local_620;
  ulong local_618;
  LinTerms local_5f0;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> local_578;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> local_4d8;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> local_438;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> local_398;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_> local_2f8;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_> local_230;
  double local_168 [4];
  LinTerms local_148;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> local_d0;
  
  local_7b8 = (eq0c->
              super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
              ).super_FunctionalConstraint.result_var_;
  if (*(size_ty *)
       ((long)&(eq0c->
               super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
               ).
               super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
               .args_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
               m_data + 0x10) == 0) {
    dVar6 = (double)(-(ulong)((eq0c->
                              super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                              ).
                              super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                              .args_.super_AlgConRhs<0>.rhs_ == 0.0) & 0x3ff0000000000000);
    FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::NarrowVarBounds((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                       *)(this->
                         super_BasicFuncConstrCvt<mp::CondEQConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::LinTerms>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                         ).
                         super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                         .mdl_cvt_,local_7b8,dVar6,dVar6);
    return;
  }
  this_00 = (BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             *)(this->
               super_BasicFuncConstrCvt<mp::CondEQConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::LinTerms>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ).
               super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               .mdl_cvt_;
  dVar6 = *(double *)(*(long *)(this_00 + 0x40) + (long)local_7b8 * 8);
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    pdVar1 = (double *)(*(long *)(this_00 + 0x58) + (long)local_7b8 * 8);
    if ((dVar6 == *pdVar1) && (!NAN(dVar6) && !NAN(*pdVar1))) {
      return;
    }
  }
  lt = &(eq0c->
        super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
        ).
        super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
        .args_.super_LinTerms;
  BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::ComputeBoundsAndType(&local_770,this_00,lt);
  pFVar3 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            *)(this->
              super_BasicFuncConstrCvt<mp::CondEQConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::LinTerms>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              ).
              super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              .mdl_cvt_;
  if (local_770.type_ == INTEGER) {
    local_7b0 = 1.0;
  }
  else {
    local_7b0 = (double)pFVar3[1].map_fixed_vars_._M_h._M_bucket_count;
  }
  dVar6 = (pFVar3->super_FlatModel<mp::DefaultFlatModelParams>).var_lb_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[local_7b8];
  if (((dVar6 == 0.0) &&
      (pdVar1 = (pFVar3->super_FlatModel<mp::DefaultFlatModelParams>).var_ub_.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start + local_7b8, dVar6 == *pdVar1)) && (!NAN(dVar6) && !NAN(*pdVar1))) {
    dVar6 = (eq0c->
            super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
            ).
            super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
            .args_.super_AlgConRhs<0>.rhs_;
    if (dVar6 - local_7b0 < local_770.lb_) {
      gch::detail::small_vector_base<std::allocator<double>,6u>::small_vector_base<6u>
                ((small_vector_base<std::allocator<double>,6u> *)local_668,lt);
      gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
                ((small_vector_base<std::allocator<int>,6u> *)&local_620,
                 &(eq0c->
                  super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                  ).
                  super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                  .args_.super_LinTerms.vars_);
      AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
                (&local_398,(LinTerms *)local_668,
                 (AlgConRhs<1>)
                 (local_7b0 +
                 (eq0c->
                 super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                 ).
                 super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                 .args_.super_AlgConRhs<0>.rhs_),true);
      NVar7 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
              ::
              AddConstraintAndTryNoteResultVariable<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>
                        ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                          *)pFVar3,&local_398);
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
      ::AutoLink(pFVar3,NVar7);
      if (6 < local_398.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data
              .super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_398.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_398.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_398.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
              m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_398.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_398.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398.super_BasicConstraint.name_._M_dataplus._M_p !=
          &local_398.super_BasicConstraint.name_.field_2) {
        operator_delete(local_398.super_BasicConstraint.name_._M_dataplus._M_p,
                        local_398.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
      }
      if (6 < local_618) {
        operator_delete(local_620,local_618 << 2);
      }
      if ((ulong)local_668._8_8_ < 7) {
        return;
      }
      uVar5 = local_668._8_8_ << 3;
      goto LAB_001b8937;
    }
    if (local_770.ub_ < dVar6 + local_7b0) {
      LinTerms::LinTerms(&local_148,lt);
      AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
                (&local_d0,&local_148,
                 (AlgConRhs<_1>)
                 ((eq0c->
                  super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                  ).
                  super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
                  .args_.super_AlgConRhs<0>.rhs_ - local_7b0),true);
      FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
      ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>
                ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                  *)pFVar3,&local_d0);
      AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint(&local_d0);
      LinTerms::~LinTerms(&local_148);
      return;
    }
  }
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::AddVars_returnIds(&local_7a8,pFVar3,2,0.0,1.0,INTEGER);
  if (local_7a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_7a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_7a8,
               (iterator)
               local_7a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_7b8);
  }
  else {
    *local_7a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = local_7b8;
    local_7a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_7a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  pFVar3 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            *)(this->
              super_BasicFuncConstrCvt<mp::CondEQConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::LinTerms>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              ).
              super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              .mdl_cvt_;
  local_168[0] = 1.0;
  local_168[1] = 1.0;
  local_168[2] = 1.0;
  __l._M_len = 3;
  __l._M_array = local_168;
  std::vector<double,_std::allocator<double>_>::vector(&local_788,__l,&local_7b1);
  LinTerms::LinTerms(&local_5f0,&local_788,&local_7a8);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
            (&local_438,&local_5f0,(AlgConRhs<1>)0x3ff0000000000000,true);
  NVar7 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::
          AddConstraintAndTryNoteResultVariable<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>
                    ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                      *)pFVar3,&local_438);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::AutoLink(pFVar3,NVar7);
  if (6 < local_438.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_438.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                    m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_438.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                    m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_438.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data
          .super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_438.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_438.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438.super_BasicConstraint.name_._M_dataplus._M_p !=
      &local_438.super_BasicConstraint.name_.field_2) {
    operator_delete(local_438.super_BasicConstraint.name_._M_dataplus._M_p,
                    local_438.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
  }
  if (6 < local_5f0.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_5f0.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_5f0.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_5f0.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_5f0.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_5f0.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if (local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_788.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pFVar4 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
            *)(this->
              super_BasicFuncConstrCvt<mp::CondEQConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::LinTerms>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              ).
              super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              .mdl_cvt_;
  iVar2 = *local_7a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  gch::detail::small_vector_base<std::allocator<double>,6u>::small_vector_base<6u>
            ((small_vector_base<std::allocator<double>,6u> *)local_6e0,lt);
  local_790 = &(eq0c->
               super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
               ).
               super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
               .args_.super_LinTerms.vars_;
  gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
            ((small_vector_base<std::allocator<int>,6u> *)&local_698);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
            (&local_4d8,(LinTerms *)local_6e0,
             (AlgConRhs<_1>)
             ((eq0c->
              super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
              ).
              super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
              .args_.super_AlgConRhs<0>.rhs_ - local_7b0),true);
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>::
  IndicatorConstraint(&local_230,iVar2,1,&local_4d8);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  ::AddConstraint<mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>>
            (pFVar4,&local_230);
  if (6 < local_230.con_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
          m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_230.con_.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_230.con_.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_230.con_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
          m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_230.con_.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_230.con_.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.con_.super_BasicConstraint.name_._M_dataplus._M_p !=
      &local_230.con_.super_BasicConstraint.name_.field_2) {
    operator_delete(local_230.con_.super_BasicConstraint.name_._M_dataplus._M_p,
                    local_230.con_.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.super_BasicConstraint.name_._M_dataplus._M_p !=
      &local_230.super_BasicConstraint.name_.field_2) {
    operator_delete(local_230.super_BasicConstraint.name_._M_dataplus._M_p,
                    local_230.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
  }
  if (6 < local_4d8.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_4d8.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                    m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_4d8.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                    m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_4d8.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data
          .super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_4d8.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_4d8.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8.super_BasicConstraint.name_._M_dataplus._M_p !=
      &local_4d8.super_BasicConstraint.name_.field_2) {
    operator_delete(local_4d8.super_BasicConstraint.name_._M_dataplus._M_p,
                    local_4d8.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
  }
  if (6 < local_690) {
    operator_delete(local_698,local_690 << 2);
  }
  if (6 < (ulong)local_6e0._8_8_) {
    operator_delete((void *)local_6e0._0_8_,local_6e0._8_8_ << 3);
  }
  pFVar4 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
            *)(this->
              super_BasicFuncConstrCvt<mp::CondEQConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::LinTerms>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              ).
              super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              .mdl_cvt_;
  iVar2 = *(int *)((long)local_7a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + 4);
  gch::detail::small_vector_base<std::allocator<double>,6u>::small_vector_base<6u>
            ((small_vector_base<std::allocator<double>,6u> *)local_758,lt);
  gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
            ((small_vector_base<std::allocator<int>,6u> *)&local_710,local_790);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
            (&local_578,(LinTerms *)local_758,
             (AlgConRhs<1>)
             (local_7b0 +
             (eq0c->
             super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
             ).
             super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>_>
             .args_.super_AlgConRhs<0>.rhs_),true);
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>::
  IndicatorConstraint(&local_2f8,iVar2,1,&local_578);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  ::AddConstraint<mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>>
            (pFVar4,&local_2f8);
  if (6 < local_2f8.con_.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
          m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_2f8.con_.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_2f8.con_.super_LinTerms.vars_.
                    super_small_vector_base<std::allocator<int>,_6U>.m_data.
                    super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_2f8.con_.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
          m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_2f8.con_.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_2f8.con_.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.con_.super_BasicConstraint.name_._M_dataplus._M_p !=
      &local_2f8.con_.super_BasicConstraint.name_.field_2) {
    operator_delete(local_2f8.con_.super_BasicConstraint.name_._M_dataplus._M_p,
                    local_2f8.con_.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.super_BasicConstraint.name_._M_dataplus._M_p !=
      &local_2f8.super_BasicConstraint.name_.field_2) {
    operator_delete(local_2f8.super_BasicConstraint.name_._M_dataplus._M_p,
                    local_2f8.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
  }
  if (6 < local_578.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
    operator_delete(local_578.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                    m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                    local_578.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                    m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
  }
  if (6 < local_578.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data
          .super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
    operator_delete(local_578.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                    local_578.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578.super_BasicConstraint.name_._M_dataplus._M_p !=
      &local_578.super_BasicConstraint.name_.field_2) {
    operator_delete(local_578.super_BasicConstraint.name_._M_dataplus._M_p,
                    local_578.super_BasicConstraint.name_.field_2._M_allocated_capacity + 1);
  }
  if (6 < local_708) {
    operator_delete(local_710,local_708 << 2);
  }
  if (6 < (ulong)local_758._8_8_) {
    operator_delete((void *)local_758._0_8_,local_758._8_8_ << 3);
  }
  if ((ptr)local_7a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start == (ptr)0x0) {
    return;
  }
  uVar5 = (long)local_7a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage -
          (long)local_7a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_668._0_8_ =
       local_7a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
LAB_001b8937:
  operator_delete((void *)local_668._0_8_,uVar5);
  return;
}

Assistant:

void ConvertCtxNeg(const ItemType& eq0c, int ) {
    const auto& con = eq0c.GetConstraint();
    const auto res = eq0c.GetResultVar();
    if (con.empty()) {
      bool valid = !con.rhs();
      GetMC().NarrowVarBounds(res, valid, valid);
    } else if ( !GetMC().is_fixed(res) ||   // not fixed, or
                !GetMC().fixed_value(res) ) // fixed to 0
    {
      auto bNt = GetMC().ComputeBoundsAndType(con.GetBody());
      double cmpEps = GetMC().ComparisonEps( bNt.get_result_type() );
#define COND_LIN_EQ__USE_FLAT_ALGEBRA
#ifndef COND_LIN_EQ__USE_FLAT_ALGEBRA
      // Not doing this.
      // Reason: the below OR propagates CTX+ into res,
      // which is the expression we are redefining,
      // but this is not necessary. See #248.
      // Happens on eqVarConst01.mod.
      /// res3 ==> (res || body <= rhs-eps || body >= rhs+eps)
      auto res3 = GetMC().AssignResultVar2Args(
          OrConstraint{ {
            res,
            GetMC().AssignResultVar2Args(   // <=
                ConditionalConstraint< AlgCon<-1> >
                { { con.GetBody(), con.rhs() - cmpEps } }),
            GetMC().AssignResultVar2Args(   // >=
                ConditionalConstraint< AlgCon<1> >
                { { con.GetBody(), con.rhs() + cmpEps } })
          } });
      GetMC().FixAsTrue(res3);
#else  // COND_LIN_EQ__USE_FLAT_ALGEBRA
      // Old way: straight to algebra and indicators.
      // This could duplicate the below indicators,
      // but simpler as of now:
      // the indicators redefine conditional inequalities
      // which, in the above variant, could have been redefined
      // in CTX- before, see int_ne_05_redef_ctx.mod,
      // thus losing the CTX+ redefinition, see #248.
      if (GetMC().is_fixed(res)  // This prepro would be unnec with logicals
          && !GetMC().fixed_value(res)) {  // preprocess: fixed to 0
        if (bNt.lb() > con.rhs() - cmpEps) { // body > value-eps
          GetMC().AddConstraint(
              AlgCon<1>{ con.GetBody(), con.rhs() + cmpEps } );
          return;
        }
        if (bNt.ub() < con.rhs() + cmpEps) { // body < value+eps
          GetMC().AddConstraint(
              AlgCon<-1>{ con.GetBody(), con.rhs() - cmpEps } );
          return;
        }
      }
      auto newvars = GetMC().AddVars_returnIds(2, 0.0, 1.0, var::INTEGER);
      newvars.push_back( res );
      GetMC().AddConstraint( LinConGE(   // b1+b2+resvar >= 1
          {{1.0, 1.0, 1.0}, newvars},
          1.0 ) );
      {
        GetMC().AddConstraint(IndicatorConstraint< AlgCon<-1> >(
            newvars[0], 1,
            { con.GetBody(),
             con.rhs() - cmpEps }));
      }
      GetMC().AddConstraint(IndicatorConstraint< AlgCon<1> >(
          newvars[1], 1,
          { con.GetBody(),
           con.rhs() + cmpEps }));
#endif  // USE_FLAT_ALGEBRA
    } // else, skip
  }